

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

string_validator __thiscall goodform::sub_form::string(sub_form *this)

{
  bool bVar1;
  undefined1 *puVar2;
  string_validator sVar3;
  allocator<char> local_51;
  string local_50;
  error_message local_30;
  
  bVar1 = is<std::__cxx11::string>(this->variant_);
  if (bVar1) {
    puVar2 = (undefined1 *)std::any_cast<std::__cxx11::string_const&>(this->variant_);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"TYPE NOT STRING",&local_51);
    error_message::error_message(&local_30,&local_50);
    std::__cxx11::string::operator=((string *)this->error_,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    puVar2 = const_string_abi_cxx11_;
  }
  sVar3.value_ = (string *)puVar2;
  sVar3.error_ = this->error_;
  return sVar3;
}

Assistant:

string_validator sub_form::string()
  {
    if (!is<std::string>(this->variant_))
    {
      this->error_ = error_message("TYPE NOT STRING");
      return string_validator(const_string, this->error_);
    }
    else
    {
      return string_validator(get<std::string>(this->variant_), this->error_);
    }
  }